

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O0

int __thiscall dit::ImageCompareTests::init(ImageCompareTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  ImageCompareTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  FuzzyComparisonMetricTests::FuzzyComparisonMetricTests
            ((FuzzyComparisonMetricTests *)pTVar1,
             (this->super_TestCaseGroup).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  BilinearCompareTests::BilinearCompareTests
            ((BilinearCompareTests *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ImageCompareTests::init (void)
{
	addChild(new FuzzyComparisonMetricTests	(m_testCtx));
	addChild(new BilinearCompareTests		(m_testCtx));
}